

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplification_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::SimplificationPass::AddNewOperands
          (SimplificationPass *this,Instruction *folded_inst,
          unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          *inst_seen,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *work_list)

{
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *this_00;
  anon_class_24_3_ca45a1d1 local_68;
  function<void_(unsigned_int_*)> local_50;
  DefUseManager *local_30;
  DefUseManager *def_use_mgr;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  *work_list_local;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *inst_seen_local;
  Instruction *folded_inst_local;
  SimplificationPass *this_local;
  
  def_use_mgr = (DefUseManager *)work_list;
  work_list_local =
       (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
       inst_seen;
  inst_seen_local =
       (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
        *)folded_inst;
  folded_inst_local = (Instruction *)this;
  local_30 = Pass::get_def_use_mgr(&this->super_Pass);
  this_00 = inst_seen_local;
  local_68.inst_seen =
       (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
        **)&work_list_local;
  local_68.def_use_mgr = &local_30;
  local_68.work_list =
       (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> **)
       &def_use_mgr;
  std::function<void(unsigned_int*)>::
  function<spvtools::opt::SimplificationPass::AddNewOperands(spvtools::opt::Instruction*,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>*,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>*)::__0,void>
            ((function<void(unsigned_int*)> *)&local_50,&local_68);
  opt::Instruction::ForEachInId((Instruction *)this_00,&local_50);
  std::function<void_(unsigned_int_*)>::~function(&local_50);
  return;
}

Assistant:

void SimplificationPass::AddNewOperands(
    Instruction* folded_inst, std::unordered_set<Instruction*>* inst_seen,
    std::vector<Instruction*>* work_list) {
  analysis::DefUseManager* def_use_mgr = get_def_use_mgr();
  folded_inst->ForEachInId(
      [&inst_seen, &def_use_mgr, &work_list](uint32_t* iid) {
        Instruction* iid_inst = def_use_mgr->GetDef(*iid);
        if (!inst_seen->insert(iid_inst).second) return;
        work_list->push_back(iid_inst);
      });
}